

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxNode *args_4;
  DefaultDisableDeclarationSyntax *pDVar1;
  DeepCloneVisitor visitor;
  Token local_70;
  Token local_60;
  Token local_50;
  Token local_40;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_70 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x70),(BumpAllocator *)__child_stack);
  args_4 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x80),(DeepCloneVisitor *)&local_60,
                      (BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x88),(BumpAllocator *)__child_stack);
  pDVar1 = BumpAllocator::
           emplace<slang::syntax::DefaultDisableDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_70,&local_40,&local_50,
                      (ExpressionSyntax *)args_4,&local_60);
  return (int)pDVar1;
}

Assistant:

static SyntaxNode* clone(const DefaultDisableDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<DefaultDisableDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.defaultKeyword.deepClone(alloc),
        node.disableKeyword.deepClone(alloc),
        node.iffKeyword.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.semi.deepClone(alloc)
    );
}